

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O0

TSSymbolType ts_language_symbol_type(TSLanguage *language,TSSymbol symbol)

{
  TSSymbolMetadata TVar1;
  TSSymbolMetadata metadata;
  TSSymbol symbol_local;
  TSLanguage *language_local;
  
  TVar1 = ts_language_symbol_metadata(language,symbol);
  if (((byte)TVar1 >> 1 & 1) == 0) {
    if (((byte)TVar1 & 1) == 0) {
      language_local._4_4_ = TSSymbolTypeAuxiliary;
    }
    else {
      language_local._4_4_ = TSSymbolTypeAnonymous;
    }
  }
  else {
    language_local._4_4_ = TSSymbolTypeRegular;
  }
  return language_local._4_4_;
}

Assistant:

TSSymbolType ts_language_symbol_type(const TSLanguage *language, TSSymbol symbol) {
  TSSymbolMetadata metadata = ts_language_symbol_metadata(language, symbol);
  if (metadata.named) {
    return TSSymbolTypeRegular;
  } else if (metadata.visible) {
    return TSSymbolTypeAnonymous;
  } else {
    return TSSymbolTypeAuxiliary;
  }
}